

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

_Bool fy_node_clear_marker(fy_node *fyn,uint marker)

{
  uint uVar1;
  uint prev_marks;
  uint marker_local;
  fy_node *fyn_local;
  
  if ((fyn == (fy_node *)0x0) || (0x18 < marker)) {
    fyn_local._7_1_ = false;
  }
  else {
    uVar1 = fyn->marks;
    fyn->marks = (1 << ((byte)marker & 0x1f) ^ 0xffffffffU) & fyn->marks;
    fyn_local._7_1_ = (uVar1 & 1 << ((byte)marker & 0x1f)) != 0;
  }
  return fyn_local._7_1_;
}

Assistant:

bool fy_node_clear_marker(struct fy_node *fyn, unsigned int marker) {
    unsigned int prev_marks;

    if (!fyn || marker > FYNWF_MAX_USER_MARKER)
        return false;
    prev_marks = fyn->marks;
    fyn->marks &= ~FY_BIT(marker);
    return !!(prev_marks & FY_BIT(marker));
}